

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
          *f)

{
  ulong uVar1;
  ostream_iterator<char,_char,_std::char_traits<char>_> *poVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char __tmp;
  char local_5a;
  char local_59;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *local_48;
  ulong local_40;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_38;
  
  uVar5 = (ulong)spec->width_;
  uVar1 = f->size_;
  lVar6 = uVar1 - uVar5;
  if (uVar1 < uVar5) {
    local_5a = (char)spec->fill_;
    uVar4 = uVar5 - uVar1;
    local_48 = f;
    if (spec->align_ == ALIGN_CENTER) {
      uVar3 = uVar4 >> 1;
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      local_59 = local_5a;
      local_40 = uVar3;
      local_38 = (ostream_iterator<char,_char,_std::char_traits<char>_> *)this;
      if (1 < uVar4) {
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      poVar2 = local_38;
      local_38->_M_stream = local_58._M_stream;
      local_38->_M_string = local_58._M_string;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)local_48,local_38);
      local_58._M_stream = poVar2->_M_stream;
      local_58._M_string = poVar2->_M_string;
      local_5a = local_59;
      if (uVar4 != local_40) {
        lVar6 = (uVar1 + local_40) - uVar5;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      local_38->_M_stream = local_58._M_stream;
      local_38->_M_string = local_58._M_string;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      if (uVar4 != 0) {
        lVar6 = uVar1 - uVar5;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      *(ostream_type **)this = local_58._M_stream;
      *(char **)(this + 8) = local_58._M_string;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)local_48,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                    *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
      local_58._M_stream = *(ostream_type **)this;
      local_58._M_string = *(char **)(this + 8);
      if (uVar4 != 0) {
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,&local_5a)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      *(ostream_type **)this = local_58._M_stream;
      *(char **)(this + 8) = local_58._M_string;
    }
    return;
  }
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
  ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
                *)f,(ostream_iterator<char,_char,_std::char_traits<char>_> *)this);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }